

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

object_ptr __thiscall
mjs::native_error_exception::make_error_object
          (native_error_exception *this,gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 uVar1;
  global_object *pgVar2;
  gc_heap *args;
  char *pcVar3;
  error_object *peVar4;
  gc_heap_ptr<mjs::global_object> *in_RDX;
  undefined8 extraout_RDX;
  object_ptr oVar5;
  wstring_view local_e0;
  string local_d0;
  value local_c0;
  string local_98;
  wstring_view local_88;
  string local_78 [2];
  string local_58;
  string local_48;
  undefined1 local_38 [8];
  gc_heap_ptr<mjs::error_object> eo;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  native_error_exception *this_local;
  
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(in_RDX);
  args = object::heap(&pgVar2->super_object);
  eo.super_gc_heap_ptr_untyped._8_8_ = args;
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(in_RDX);
  pcVar3 = type_string(*(native_error_type *)&global[1].super_gc_heap_ptr_untyped.heap_);
  (*(pgVar2->super_object)._vptr_object[0x13])(&local_48,pgVar2,pcVar3);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(in_RDX);
  (*(pgVar2->super_object)._vptr_object[0x10])
            (&local_58,pgVar2,(ulong)*(uint *)&global[1].super_gc_heap_ptr_untyped.heap_);
  uVar1 = eo.super_gc_heap_ptr_untyped._8_8_;
  local_88 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view
                       ((wstring *)&global[3].super_gc_heap_ptr_untyped.pos_);
  string::string(local_78,(gc_heap *)uVar1,&local_88);
  gc_heap::
  make<mjs::error_object,mjs::native_error_type_const&,mjs::string,mjs::gc_heap_ptr<mjs::object>,mjs::string>
            ((gc_heap *)local_38,(native_error_type *)args,(string *)(global + 1),
             (gc_heap_ptr<mjs::object> *)&local_48,&local_58);
  string::~string(local_78);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&local_58);
  string::~string(&local_48);
  peVar4 = gc_heap_ptr<mjs::error_object>::operator->((gc_heap_ptr<mjs::error_object> *)local_38);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(in_RDX);
  (*(pgVar2->super_object)._vptr_object[0x13])(&local_98,pgVar2,"message");
  uVar1 = eo.super_gc_heap_ptr_untyped._8_8_;
  local_e0 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view
                       ((wstring *)&global[1].super_gc_heap_ptr_untyped.pos_);
  string::string(&local_d0,(gc_heap *)uVar1,&local_e0);
  value::value(&local_c0,&local_d0);
  (*(peVar4->super_native_object).super_object._vptr_object[1])(peVar4,&local_98,&local_c0,6);
  value::~value(&local_c0);
  string::~string(&local_d0);
  string::~string(&local_98);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::error_object,void>
            ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::error_object> *)local_38);
  gc_heap_ptr<mjs::error_object>::~gc_heap_ptr((gc_heap_ptr<mjs::error_object> *)local_38);
  oVar5.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar5.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar5.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr native_error_exception::make_error_object(const gc_heap_ptr<global_object>& global) const {
    auto& h = global->heap();
    auto eo = h.make<error_object>(type_, global->common_string(type_string(type_)), global->error_prototype(type_), string{h, stack_trace_});
    eo->put(global->common_string("message"), value{string{h, msg_}}, message_attributes);
    return eo;
}